

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
gms_matcher::GetNB9(vector<int,_std::allocator<int>_> *__return_storage_ptr__,gms_matcher *this,
                   int idx,Size *GridSize)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  int idx_yy;
  long lVar7;
  long lVar8;
  
  piVar4 = (pointer)operator_new(0x24);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar4;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar4 + 9;
  *piVar4 = -1;
  piVar4[1] = -1;
  piVar4[2] = -1;
  piVar4[3] = -1;
  piVar4[4] = -1;
  piVar4[5] = -1;
  piVar4[6] = -1;
  piVar4[7] = -1;
  piVar4[8] = -1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar4 + 9;
  iVar2 = GridSize->width;
  iVar3 = GridSize->height;
  iVar5 = (idx / iVar2 + -1) * iVar2 + idx % iVar2 + -1;
  lVar6 = -1;
  do {
    lVar1 = lVar6 + idx / iVar2;
    lVar7 = 0;
    do {
      lVar8 = (long)(idx % iVar2) + -1 + lVar7;
      if ((((-1 < lVar8) && (lVar8 < iVar2)) && (-1 < lVar1)) && (lVar1 < iVar3)) {
        piVar4[lVar7] = iVar5 + (int)lVar7;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    piVar4 = piVar4 + 3;
    iVar5 = iVar5 + iVar2;
  } while (lVar6 != 2);
  return __return_storage_ptr__;
}

Assistant:

vector<int> GetNB9(const int idx, const Size& GridSize) {
		vector<int> NB9(9, -1);

		int idx_x = idx % GridSize.width;
		int idx_y = idx / GridSize.width;

		for (int yi = -1; yi <= 1; yi++)
		{
			for (int xi = -1; xi <= 1; xi++)
			{	
				int idx_xx = idx_x + xi;
				int idx_yy = idx_y + yi;

				if (idx_xx < 0 || idx_xx >= GridSize.width || idx_yy < 0 || idx_yy >= GridSize.height)
					continue;

				NB9[xi + 4 + yi * 3] = idx_xx + idx_yy * GridSize.width;
			}
		}
		return NB9;
	}